

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# T.c
# Opt level: O3

int envy_bios_parse_bit_T(envy_bios *bios,envy_bios_bit_entry *bit)

{
  byte bVar1;
  ushort uVar2;
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  uint8_t uVar6;
  byte bVar7;
  int iVar8;
  uint uVar9;
  envy_bios_T_tmds_info_entry *peVar10;
  short sVar11;
  long lVar12;
  ulong uVar13;
  uint uVar14;
  int iVar15;
  undefined1 auVar16 [16];
  int iVar17;
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  int iVar35;
  int iVar38;
  undefined1 auVar36 [16];
  int iVar39;
  undefined1 auVar37 [16];
  undefined1 in_XMM11 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 in_XMM12 [16];
  undefined1 auVar42 [16];
  
  (bios->T).bit = bit;
  uVar14 = 0;
  do {
    iVar8 = parse_at(bios,uVar14,(char **)0x0);
    uVar14 = uVar14 + 1;
  } while (iVar8 == 0);
  uVar2 = (bios->T).tmds_info.offset;
  if (uVar2 != 0) {
    if ((uint)uVar2 < bios->length) {
      uVar6 = bios->data[(uint)uVar2];
      (bios->T).tmds_info.version = uVar6;
    }
    else {
      (bios->T).tmds_info.version = '\0';
      fprintf(_stderr,"requested OOB u8 at 0x%04x\n");
      uVar6 = (bios->T).tmds_info.version;
    }
    if ((uVar6 == ' ') || (uVar6 == '\x11')) {
      uVar13 = (ulong)(bios->T).tmds_info.offset;
      uVar14 = bios->length;
      if ((uint)(uVar13 + 1) < uVar14) {
        (bios->T).tmds_info.hlen = bios->data[uVar13 + 1];
        iVar8 = 0;
      }
      else {
        (bios->T).tmds_info.hlen = '\0';
        fprintf(_stderr,"requested OOB u8 at 0x%04x\n");
        uVar13 = (ulong)(bios->T).tmds_info.offset;
        uVar14 = bios->length;
        iVar8 = -0xe;
      }
      uVar9 = (uint)uVar13;
      if ((uint)(uVar13 + 2) < uVar14) {
        (bios->T).tmds_info.rlen = bios->data[uVar13 + 2];
        iVar15 = 0;
      }
      else {
        (bios->T).tmds_info.rlen = '\0';
        fprintf(_stderr,"requested OOB u8 at 0x%04x\n");
        uVar9 = (uint)(bios->T).tmds_info.offset;
        uVar14 = bios->length;
        iVar15 = -0xe;
      }
      if ((uint)((ulong)uVar9 + 3) < uVar14) {
        bVar7 = bios->data[(ulong)uVar9 + 3];
        (bios->T).tmds_info.entriesnum = bVar7;
        iVar39 = 0;
      }
      else {
        (bios->T).tmds_info.entriesnum = '\0';
        fprintf(_stderr,"requested OOB u8 at 0x%04x\n");
        bVar7 = (bios->T).tmds_info.entriesnum;
        iVar39 = -0xe;
      }
      (bios->T).tmds_info.valid = (iVar15 == 0 && iVar8 == 0) && iVar39 == 0;
      peVar10 = (envy_bios_T_tmds_info_entry *)malloc((ulong)((uint)bVar7 + (uint)bVar7));
      (bios->T).tmds_info.entries = peVar10;
      auVar5 = _DAT_00273c40;
      if (bVar7 != 0) {
        bVar1 = (bios->T).tmds_info.rlen;
        lVar12 = (ulong)bVar7 - 1;
        auVar16._8_4_ = (int)lVar12;
        auVar16._0_8_ = lVar12;
        auVar16._12_4_ = (int)((ulong)lVar12 >> 0x20);
        sVar11 = (ushort)(bios->T).tmds_info.hlen + (bios->T).tmds_info.offset;
        uVar13 = 0;
        auVar16 = auVar16 ^ _DAT_00273c40;
        auVar18 = _DAT_00273c00;
        auVar19 = _DAT_00273c10;
        auVar20 = _DAT_00273c20;
        auVar21 = _DAT_00273c30;
        do {
          auVar22 = auVar21 ^ auVar5;
          iVar8 = auVar16._0_4_;
          iVar35 = -(uint)(iVar8 < auVar22._0_4_);
          iVar15 = auVar16._4_4_;
          auVar23._4_4_ = -(uint)(iVar15 < auVar22._4_4_);
          iVar39 = auVar16._8_4_;
          iVar38 = -(uint)(iVar39 < auVar22._8_4_);
          iVar17 = auVar16._12_4_;
          auVar23._12_4_ = -(uint)(iVar17 < auVar22._12_4_);
          auVar32._4_4_ = iVar35;
          auVar32._0_4_ = iVar35;
          auVar32._8_4_ = iVar38;
          auVar32._12_4_ = iVar38;
          auVar40 = pshuflw(in_XMM11,auVar32,0xe8);
          auVar25._4_4_ = -(uint)(auVar22._4_4_ == iVar15);
          auVar25._12_4_ = -(uint)(auVar22._12_4_ == iVar17);
          auVar25._0_4_ = auVar25._4_4_;
          auVar25._8_4_ = auVar25._12_4_;
          auVar42 = pshuflw(in_XMM12,auVar25,0xe8);
          auVar23._0_4_ = auVar23._4_4_;
          auVar23._8_4_ = auVar23._12_4_;
          auVar41 = pshuflw(auVar40,auVar23,0xe8);
          auVar22._8_4_ = 0xffffffff;
          auVar22._0_8_ = 0xffffffffffffffff;
          auVar22._12_4_ = 0xffffffff;
          auVar22 = (auVar41 | auVar42 & auVar40) ^ auVar22;
          auVar22 = packssdw(auVar22,auVar22);
          if ((auVar22 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
            *(short *)((long)&peVar10->offset + uVar13) = sVar11;
          }
          auVar23 = auVar25 & auVar32 | auVar23;
          auVar22 = packssdw(auVar23,auVar23);
          auVar41._8_4_ = 0xffffffff;
          auVar41._0_8_ = 0xffffffffffffffff;
          auVar41._12_4_ = 0xffffffff;
          auVar22 = packssdw(auVar22 ^ auVar41,auVar22 ^ auVar41);
          if ((auVar22._0_4_ >> 0x10 & 1) != 0) {
            *(ushort *)((long)&peVar10[1].offset + uVar13) = (ushort)bVar1 + sVar11;
          }
          auVar22 = auVar20 ^ auVar5;
          iVar35 = -(uint)(iVar8 < auVar22._0_4_);
          auVar36._4_4_ = -(uint)(iVar15 < auVar22._4_4_);
          iVar38 = -(uint)(iVar39 < auVar22._8_4_);
          auVar36._12_4_ = -(uint)(iVar17 < auVar22._12_4_);
          auVar24._4_4_ = iVar35;
          auVar24._0_4_ = iVar35;
          auVar24._8_4_ = iVar38;
          auVar24._12_4_ = iVar38;
          auVar31._4_4_ = -(uint)(auVar22._4_4_ == iVar15);
          auVar31._12_4_ = -(uint)(auVar22._12_4_ == iVar17);
          auVar31._0_4_ = auVar31._4_4_;
          auVar31._8_4_ = auVar31._12_4_;
          auVar36._0_4_ = auVar36._4_4_;
          auVar36._8_4_ = auVar36._12_4_;
          auVar22 = auVar31 & auVar24 | auVar36;
          auVar22 = packssdw(auVar22,auVar22);
          auVar3._8_4_ = 0xffffffff;
          auVar3._0_8_ = 0xffffffffffffffff;
          auVar3._12_4_ = 0xffffffff;
          auVar22 = packssdw(auVar22 ^ auVar3,auVar22 ^ auVar3);
          if ((auVar22 & (undefined1  [16])0x100000000) != (undefined1  [16])0x0) {
            *(ushort *)((long)&peVar10[2].offset + uVar13) = (ushort)bVar1 + (ushort)bVar1 + sVar11;
          }
          auVar25 = pshufhw(auVar24,auVar24,0x84);
          auVar32 = pshufhw(auVar31,auVar31,0x84);
          auVar23 = pshufhw(auVar25,auVar36,0x84);
          auVar26._8_4_ = 0xffffffff;
          auVar26._0_8_ = 0xffffffffffffffff;
          auVar26._12_4_ = 0xffffffff;
          auVar26 = (auVar23 | auVar32 & auVar25) ^ auVar26;
          auVar25 = packssdw(auVar26,auVar26);
          if ((auVar25 & (undefined1  [16])0x1000000000000) != (undefined1  [16])0x0) {
            *(ushort *)((long)&peVar10[3].offset + uVar13) =
                 (ushort)bVar1 + (ushort)bVar1 * 2 + sVar11;
          }
          auVar25 = auVar19 ^ auVar5;
          iVar35 = -(uint)(iVar8 < auVar25._0_4_);
          auVar28._4_4_ = -(uint)(iVar15 < auVar25._4_4_);
          iVar38 = -(uint)(iVar39 < auVar25._8_4_);
          auVar28._12_4_ = -(uint)(iVar17 < auVar25._12_4_);
          auVar33._4_4_ = iVar35;
          auVar33._0_4_ = iVar35;
          auVar33._8_4_ = iVar38;
          auVar33._12_4_ = iVar38;
          auVar22 = pshuflw(auVar22,auVar33,0xe8);
          auVar27._4_4_ = -(uint)(auVar25._4_4_ == iVar15);
          auVar27._12_4_ = -(uint)(auVar25._12_4_ == iVar17);
          auVar27._0_4_ = auVar27._4_4_;
          auVar27._8_4_ = auVar27._12_4_;
          in_XMM12 = pshuflw(auVar42 & auVar40,auVar27,0xe8);
          in_XMM12 = in_XMM12 & auVar22;
          auVar28._0_4_ = auVar28._4_4_;
          auVar28._8_4_ = auVar28._12_4_;
          auVar22 = pshuflw(auVar22,auVar28,0xe8);
          auVar40._8_4_ = 0xffffffff;
          auVar40._0_8_ = 0xffffffffffffffff;
          auVar40._12_4_ = 0xffffffff;
          auVar40 = (auVar22 | in_XMM12) ^ auVar40;
          auVar22 = packssdw(auVar40,auVar40);
          if ((auVar22 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
            *(ushort *)((long)&peVar10[4].offset + uVar13) = (ushort)bVar1 * 4 + sVar11;
          }
          auVar28 = auVar27 & auVar33 | auVar28;
          auVar22 = packssdw(auVar28,auVar28);
          auVar42._8_4_ = 0xffffffff;
          auVar42._0_8_ = 0xffffffffffffffff;
          auVar42._12_4_ = 0xffffffff;
          auVar22 = packssdw(auVar22 ^ auVar42,auVar22 ^ auVar42);
          if ((auVar22 & (undefined1  [16])0x10000) != (undefined1  [16])0x0) {
            *(ushort *)((long)&peVar10[5].offset + uVar13) =
                 (ushort)bVar1 + (ushort)bVar1 * 4 + sVar11;
          }
          auVar22 = auVar18 ^ auVar5;
          iVar8 = -(uint)(iVar8 < auVar22._0_4_);
          auVar37._4_4_ = -(uint)(iVar15 < auVar22._4_4_);
          iVar39 = -(uint)(iVar39 < auVar22._8_4_);
          auVar37._12_4_ = -(uint)(iVar17 < auVar22._12_4_);
          auVar29._4_4_ = iVar8;
          auVar29._0_4_ = iVar8;
          auVar29._8_4_ = iVar39;
          auVar29._12_4_ = iVar39;
          auVar34._4_4_ = -(uint)(auVar22._4_4_ == iVar15);
          auVar34._12_4_ = -(uint)(auVar22._12_4_ == iVar17);
          auVar34._0_4_ = auVar34._4_4_;
          auVar34._8_4_ = auVar34._12_4_;
          auVar37._0_4_ = auVar37._4_4_;
          auVar37._8_4_ = auVar37._12_4_;
          auVar22 = auVar34 & auVar29 | auVar37;
          auVar22 = packssdw(auVar22,auVar22);
          auVar4._8_4_ = 0xffffffff;
          auVar4._0_8_ = 0xffffffffffffffff;
          auVar4._12_4_ = 0xffffffff;
          in_XMM11 = packssdw(auVar22 ^ auVar4,auVar22 ^ auVar4);
          if ((in_XMM11 & (undefined1  [16])0x100000000) != (undefined1  [16])0x0) {
            *(ushort *)((long)&peVar10[6].offset + uVar13) =
                 ((ushort)bVar1 + (ushort)bVar1) * 3 + sVar11;
          }
          auVar22 = pshufhw(auVar29,auVar29,0x84);
          auVar23 = pshufhw(auVar34,auVar34,0x84);
          auVar25 = pshufhw(auVar22,auVar37,0x84);
          auVar30._8_4_ = 0xffffffff;
          auVar30._0_8_ = 0xffffffffffffffff;
          auVar30._12_4_ = 0xffffffff;
          auVar30 = (auVar25 | auVar23 & auVar22) ^ auVar30;
          auVar22 = packssdw(auVar30,auVar30);
          if ((auVar22 & (undefined1  [16])0x1000000000000) != (undefined1  [16])0x0) {
            *(ushort *)((long)&peVar10[7].offset + uVar13) =
                 ((ushort)bVar1 * 8 - (ushort)bVar1) + sVar11;
          }
          lVar12 = auVar21._8_8_;
          auVar21._0_8_ = auVar21._0_8_ + 8;
          auVar21._8_8_ = lVar12 + 8;
          lVar12 = auVar20._8_8_;
          auVar20._0_8_ = auVar20._0_8_ + 8;
          auVar20._8_8_ = lVar12 + 8;
          lVar12 = auVar19._8_8_;
          auVar19._0_8_ = auVar19._0_8_ + 8;
          auVar19._8_8_ = lVar12 + 8;
          lVar12 = auVar18._8_8_;
          auVar18._0_8_ = auVar18._0_8_ + 8;
          auVar18._8_8_ = lVar12 + 8;
          sVar11 = sVar11 + (ushort)bVar1 * 8;
          uVar13 = uVar13 + 0x10;
        } while (((uint)bVar7 * 2 + 0xe & 0xfffffff0) != uVar13);
      }
    }
    else {
      envy_bios_parse_bit_T_cold_1();
    }
  }
  return 0;
}

Assistant:

int
envy_bios_parse_bit_T(struct envy_bios *bios, struct envy_bios_bit_entry *bit)
{
	struct envy_bios_T *t = &bios->T;
	unsigned int idx = 0;

	t->bit = bit;

	while (!parse_at(bios, idx, NULL))
		idx++;

	/* parse tables */
	envy_bios_parse_T_tmds_info(bios);

	return 0;
}